

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O3

int __thiscall
s2builderutil::anon_unknown_0::DegeneracyFinder::ContainsVertexSign
          (DegeneracyFinder *this,VertexId v0)

{
  btree_map<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256>
  *this_00;
  int iVar1;
  pointer pVVar2;
  pointer piVar3;
  pointer ppVar4;
  int iVar5;
  mapped_type *pmVar6;
  long lVar7;
  long lVar8;
  S2ContainsVertexQuery query;
  S2ContainsVertexQuery local_68;
  
  lVar8 = (long)v0;
  pVVar2 = (this->g_->vertices_->
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_68.target_.c_[2] = pVVar2[lVar8].c_[2];
  this_00 = &local_68.edge_map_;
  pVVar2 = pVVar2 + lVar8;
  local_68.target_.c_[0] = pVVar2->c_[0];
  local_68.target_.c_[1] = pVVar2->c_[1];
  local_68.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_2UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            )(Storage<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_2UL,_false>
              )0x0;
  local_68.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  local_68.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = piVar3[lVar8];
  iVar1 = piVar3[lVar8 + 1];
  if (iVar5 != iVar1) {
    ppVar4 = (((this->out_).edges_)->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    lVar7 = (long)iVar5 << 3;
    do {
      pmVar6 = gtl::internal_btree::
               btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               ::operator[](&this_00->
                             super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                            ,(this->g_->vertices_->
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
                             ._M_impl.super__Vector_impl_data._M_start +
                             *(int *)((long)&ppVar4->second + lVar7));
      *pmVar6 = *pmVar6 + 1;
      lVar7 = lVar7 + 8;
    } while ((long)iVar1 * 8 != lVar7);
  }
  piVar3 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = piVar3[lVar8];
  iVar1 = piVar3[lVar8 + 1];
  if (iVar5 != iVar1) {
    piVar3 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)iVar5 << 2;
    do {
      pmVar6 = gtl::internal_btree::
               btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               ::operator[](&this_00->
                             super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                            ,(this->g_->vertices_->
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
                             ._M_impl.super__Vector_impl_data._M_start +
                             (this->g_->edges_->
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_start
                             [*(int *)((long)piVar3 + lVar8)].first);
      *pmVar6 = *pmVar6 + -1;
      lVar8 = lVar8 + 4;
    } while ((long)iVar1 * 4 != lVar8);
  }
  iVar5 = S2ContainsVertexQuery::ContainsSign(&local_68);
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  ::~btree((btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
            *)this_00);
  return iVar5;
}

Assistant:

int DegeneracyFinder::ContainsVertexSign(VertexId v0) const {
  S2ContainsVertexQuery query(g_.vertex(v0));
  for (const Edge& edge : out_.edges(v0)) {
    query.AddEdge(g_.vertex(edge.second), 1);
  }
  for (EdgeId e : in_.edge_ids(v0)) {
    query.AddEdge(g_.vertex(g_.edge(e).first), -1);
  }
  return query.ContainsSign();
}